

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PopClipRect(ImDrawList *this)

{
  float fVar1;
  ImVec4 *local_20;
  ImDrawList *this_local;
  
  ImVector<ImVec4>::pop_back(&this->_ClipRectStack);
  if ((this->_ClipRectStack).Size == 0) {
    local_20 = &this->_Data->ClipRectFullscreen;
  }
  else {
    local_20 = (this->_ClipRectStack).Data + ((this->_ClipRectStack).Size + -1);
  }
  fVar1 = local_20->y;
  (this->_CmdHeader).ClipRect.x = local_20->x;
  (this->_CmdHeader).ClipRect.y = fVar1;
  fVar1 = local_20->w;
  (this->_CmdHeader).ClipRect.z = local_20->z;
  (this->_CmdHeader).ClipRect.w = fVar1;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PopClipRect()
{
    _ClipRectStack.pop_back();
    _CmdHeader.ClipRect = (_ClipRectStack.Size == 0) ? _Data->ClipRectFullscreen : _ClipRectStack.Data[_ClipRectStack.Size - 1];
    _OnChangedClipRect();
}